

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DarknetUtility.cpp
# Opt level: O3

void __thiscall
DarknetUtility::drawPred
          (DarknetUtility *this,int classId,float conf,int left,int top,int right,int bottom,
          Mat *frame)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 uVar5;
  long *plVar6;
  int baseLine;
  Size labelSize;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int local_fc;
  undefined8 local_f8;
  Mat *pMStack_f0;
  long local_e8;
  long lStack_e0;
  int local_d0;
  int local_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  long local_b8 [3];
  long *local_a0;
  Mat *local_98;
  long local_90 [2];
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_e8 = 0;
  local_f8 = (long *)CONCAT44(local_f8._4_4_,0x3010000);
  pMStack_f0 = frame;
  local_c8 = 0;
  uStack_c4 = 0;
  uStack_c0 = 0;
  uStack_bc = 0x406fe000;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_68 = right;
  local_64 = bottom;
  local_60 = left;
  local_5c = top;
  cv::rectangle();
  cv::format_abi_cxx11_((char *)&local_c8,SUB84((double)conf,0),"%.2f");
  pbVar1 = (this->classes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->classes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    if ((int)((ulong)((long)pbVar2 - (long)pbVar1) >> 5) <= classId) {
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"classId < (int)classes.size()","");
      uVar5 = cv::error(-0xd7,(string *)&local_f8,"drawPred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DimasVeliz[P]OpenCvDnnPythonAndBasicCpp/darknetUtility/src/DarknetUtility.cpp"
                        ,0x54);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if ((long *)CONCAT44(uStack_c4,local_c8) != local_b8) {
        operator_delete((long *)CONCAT44(uStack_c4,local_c8),local_b8[0] + 1);
      }
      _Unwind_Resume(uVar5);
    }
    pcVar3 = pbVar1[classId]._M_dataplus._M_p;
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar3,pcVar3 + pbVar1[classId]._M_string_length);
    std::__cxx11::string::append((char *)&local_a0);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,CONCAT44(uStack_c4,local_c8))
    ;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_e8 = *plVar6;
      lStack_e0 = plVar4[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar6;
      local_f8 = (long *)*plVar4;
    }
    pMStack_f0 = (Mat *)plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
  }
  cv::getTextSize((string *)&local_d0,(int)&local_c8,0.5,0,(int *)0x1);
  if (top < local_cc) {
    top = local_cc;
  }
  local_90[0] = 0;
  local_a0 = (long *)CONCAT44(local_a0._4_4_,0x3010000);
  local_98 = frame;
  local_6c = top - local_cc;
  local_78 = local_d0 + left;
  local_74 = local_fc + top;
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0x406fe000;
  pMStack_f0 = (Mat *)0x406fe00000000000;
  local_e8 = 0x406fe00000000000;
  lStack_e0 = 0x406fe00000000000;
  local_70 = left;
  cv::rectangle();
  local_e8 = 0;
  local_f8 = (long *)CONCAT44(local_f8._4_4_,0x3010000);
  pMStack_f0 = frame;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_80 = left;
  local_7c = top;
  cv::putText(0,&local_f8,&local_c8,&local_80,0,&local_58,1,8,0);
  if ((long *)CONCAT44(uStack_c4,local_c8) != local_b8) {
    operator_delete((long *)CONCAT44(uStack_c4,local_c8),local_b8[0] + 1);
  }
  return;
}

Assistant:

void DarknetUtility::drawPred(int classId, float conf, int left, int top, int right, int bottom, Mat &frame)
{
    rectangle(frame, Point(left, top), Point(right, bottom), Scalar(0, 255, 0));
    std::string label = format("%.2f", conf);

    if (!classes.empty())
    {
        CV_Assert(classId < (int)classes.size());
        label = classes[classId] + ": " + label;
    }
    int baseLine;
    Size labelSize = getTextSize(label, FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);
    top = max(top, labelSize.height);
    rectangle(frame, Point(left, top - labelSize.height),
              Point(left + labelSize.width, top + baseLine), Scalar::all(255), FILLED);
    putText(frame, label, Point(left, top), FONT_HERSHEY_SIMPLEX, 0.5, Scalar());
}